

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O1

void __thiscall
adios2::query::BlockIndex<int>::Evaluate
          (BlockIndex<int> *this,QueryVar *query,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *resultBlockIDs)

{
  pointer pMVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  Dims currShape;
  Dims local_40;
  MinVarInfo *MinBlocksInfo;
  
  if (this->m_VarPtr != (Variable<int> *)0x0) {
    iVar3 = (*this->m_IdxReader->_vptr_Engine[4])();
    core::VariableBase::Shape(&local_40,&this->m_VarPtr->super_VariableBase,0xffffffffffffffff);
    bVar2 = QueryVar::IsSelectionValid(query,&local_40);
    if (bVar2) {
      iVar4 = (*this->m_IdxReader->_vptr_Engine[0xb])
                        (this->m_IdxReader,this->m_VarPtr,CONCAT44(extraout_var,iVar3));
      MinBlocksInfo = (MinVarInfo *)CONCAT44(extraout_var_00,iVar4);
      if (MinBlocksInfo == (MinVarInfo *)0x0) {
        RunStatBlocksInfo(this,query,CONCAT44(extraout_var,iVar3),resultBlockIDs);
      }
      else {
        RunStatMinBlocksInfo(this,query,MinBlocksInfo,resultBlockIDs);
        pMVar1 = (MinBlocksInfo->BlocksInfo).
                 super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pMVar1 != (pointer)0x0) {
          operator_delete(pMVar1);
        }
        operator_delete(MinBlocksInfo);
      }
    }
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unable to evaluate query! Invalid Variable detected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Evaluate(const QueryVar &query, std::vector<BlockHit> &resultBlockIDs)
    {
        if (nullptr == m_VarPtr)
        {
            throw std::runtime_error("Unable to evaluate query! Invalid Variable detected");
        }

        size_t currStep = m_IdxReader.CurrentStep();
        adios2::Dims currShape = m_VarPtr->Shape();
        if (!query.IsSelectionValid(currShape))
            return;

        auto MinBlocksInfo = m_IdxReader.MinBlocksInfo(*m_VarPtr, currStep);

        if (MinBlocksInfo != nullptr)
        {
            RunStatMinBlocksInfo(query, MinBlocksInfo, resultBlockIDs);
            delete MinBlocksInfo;
        }
        else
        {
            RunStatBlocksInfo(query, currStep, resultBlockIDs);
        }
    }